

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_28ebc5::ArgParser::argEndPages(ArgParser *this)

{
  element_type *this_00;
  shared_ptr<QPDFJob::PagesConfig> local_20;
  ArgParser *local_10;
  ArgParser *this_local;
  
  local_10 = this;
  this_00 = std::__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->c_pages);
  QPDFJob::PagesConfig::endPages(this_00);
  std::shared_ptr<QPDFJob::PagesConfig>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<QPDFJob::PagesConfig>::operator=(&this->c_pages,&local_20);
  std::shared_ptr<QPDFJob::PagesConfig>::~shared_ptr(&local_20);
  return;
}

Assistant:

void
ArgParser::argEndPages()
{
    c_pages->endPages();
    c_pages = nullptr;
}